

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessXFBTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::DirectStateAccess::TransformFeedback::BuffersTest::prepareTestSetup(BuffersTest *this)

{
  ostringstream *poVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  Enum<int,_2UL> local_1a8;
  undefined1 local_198 [384];
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  (*this->m_gl_TransformFeedbackBufferBase)(this->m_xfb_dsa,0,this->m_bo_a);
  iVar3 = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
  if (iVar3 == 0) {
    (*this->m_gl_TransformFeedbackBufferRange)(this->m_xfb_dsa,1,this->m_bo_b,0,0x100);
    (*this->m_gl_TransformFeedbackBufferRange)(this->m_xfb_dsa,2,this->m_bo_b,0x100,0x100);
    local_1a8.m_value = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
    if (local_1a8.m_value == 0) {
      return true;
    }
    local_198._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_198 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,
                    "glTransformFeedbackBufferRange has generated unexpected error (");
    local_1a8.m_getName = glu::getErrorName;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1a8,(ostream *)poVar1);
    std::operator<<((ostream *)poVar1,"). Test Failed.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_198._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_198 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,
                    "glTransformFeedbackBufferBase has generated unexpected error (");
    local_1a8.m_getName = glu::getErrorName;
    local_1a8.m_value = iVar3;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1a8,(ostream *)poVar1);
    std::operator<<((ostream *)poVar1,"). Test Failed.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_198 + 8));
  return false;
}

Assistant:

bool BuffersTest::prepareTestSetup()
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Bind Buffer Object to first indexed binding point. */
	m_gl_TransformFeedbackBufferBase(m_xfb_dsa, 0, m_bo_a);

	/* Check errors. */
	glw::GLenum error_value = gl.getError();

	if (GL_NONE != error_value)
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "glTransformFeedbackBufferBase has generated unexpected error ("
			<< glu::getErrorStr(error_value) << "). Test Failed." << tcu::TestLog::EndMessage;

		return false;
	}

	/* Bind Buffer Object to second and third indexed binding point. */
	m_gl_TransformFeedbackBufferRange(m_xfb_dsa, 1, m_bo_b, 0, s_bo_size / 2);
	m_gl_TransformFeedbackBufferRange(m_xfb_dsa, 2, m_bo_b, s_bo_size / 2, s_bo_size / 2);

	/* Check errors. */
	error_value = gl.getError();

	if (GL_NONE != error_value)
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "glTransformFeedbackBufferRange has generated unexpected error ("
			<< glu::getErrorStr(error_value) << "). Test Failed." << tcu::TestLog::EndMessage;

		return false;
	}

	return true;
}